

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

ostream * s2pred::operator<<(ostream *os,Excluded excluded)

{
  long lVar1;
  char *pcVar2;
  
  switch(excluded) {
  case FIRST:
    pcVar2 = "FIRST";
    lVar1 = 5;
    break;
  case SECOND:
    pcVar2 = "SECOND";
    lVar1 = 6;
    break;
  case NEITHER:
    pcVar2 = "NEITHER";
    lVar1 = 7;
    break;
  case UNCERTAIN:
    pcVar2 = "UNCERTAIN";
    lVar1 = 9;
    break;
  default:
    pcVar2 = "Unknown enum value";
    lVar1 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Excluded excluded) {
  switch (excluded) {
    case Excluded::FIRST: return os << "FIRST";
    case Excluded::SECOND: return os << "SECOND";
    case Excluded::NEITHER: return os << "NEITHER";
    case Excluded::UNCERTAIN: return os << "UNCERTAIN";
    default: return os << "Unknown enum value";
  }
}